

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

bool __thiscall IntElemDomain<0,_4,_0>::propagate(IntElemDomain<0,_4,_0> *this)

{
  IntView<0> *this_00;
  IntView<4> *this_01;
  uint *puVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Tint *pTVar9;
  Clause *this_02;
  Lit *pLVar10;
  IntVar *pIVar11;
  IntView<0> *pIVar12;
  IntVar *pIVar13;
  uint *puVar14;
  int i;
  ulong uVar15;
  ulong uVar16;
  int i_1;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  iterator i_2;
  
  this_00 = &this->y;
  pIVar11 = (this->y).var;
  lVar18 = (long)(pIVar11->min).v;
  this_01 = &this->x;
  do {
    if ((pIVar11->max).v < lVar18) {
      iVar4 = (this_01->var->min).v;
      if (iVar4 != (this_01->var->max).v) {
        return true;
      }
      uVar5 = (this->x).b + iVar4;
      pIVar12 = (this->a).data;
      pIVar13 = pIVar12[uVar5].var;
      pIVar12 = pIVar12 + uVar5;
      iVar4 = (pIVar13->min).v;
      iVar6 = (pIVar11->min).v;
      if (iVar6 < iVar4) {
        if (so.lazy == true) {
          iVar6 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])(pIVar13);
          uVar7 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar20 = (ulong)uVar7 << 0x20 | (long)iVar6 << 2 | 3;
          pIVar11 = this_00->var;
        }
        else {
          uVar20 = 0;
        }
        iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar11,(long)iVar4,uVar20,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar11 = this_00->var;
        iVar6 = (pIVar11->min).v;
        pIVar13 = pIVar12->var;
        iVar4 = (pIVar13->min).v;
      }
      if (iVar4 < iVar6) {
        if (so.lazy == true) {
          iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[8])();
          uVar7 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar20 = (ulong)uVar7 << 0x20 | (long)iVar4 << 2 | 3;
          pIVar13 = pIVar12->var;
        }
        else {
          uVar20 = 0;
        }
        iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar13,(long)iVar6,uVar20,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar13 = pIVar12->var;
        pIVar11 = this_00->var;
      }
      iVar4 = (pIVar13->max).v;
      iVar6 = (pIVar11->max).v;
      if (iVar4 < iVar6) {
        if (so.lazy == true) {
          iVar6 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])(pIVar13);
          uVar7 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar20 = (ulong)uVar7 << 0x20 | (long)iVar6 << 2 | 3;
          pIVar11 = this_00->var;
        }
        else {
          uVar20 = 0;
        }
        iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar11,(long)iVar4,uVar20,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
        pIVar11 = this_00->var;
        iVar6 = (pIVar11->max).v;
        pIVar13 = pIVar12->var;
        iVar4 = (pIVar13->max).v;
      }
      if (iVar6 < iVar4) {
        if (so.lazy == true) {
          iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[9])();
          uVar7 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
          uVar20 = (ulong)uVar7 << 0x20 | (long)iVar4 << 2 | 3;
          pIVar13 = pIVar12->var;
        }
        else {
          uVar20 = 0;
        }
        iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar13,(long)iVar6,uVar20,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      pIVar12 = (this->a).data;
      i_2.forward.var = pIVar12[uVar5].var;
      i_2.view = pIVar12 + uVar5;
      i_2.forward.val = ((i_2.forward.var)->min).v;
      do {
        do {
          iVar4 = i_2.forward.val;
          IntVar::iterator::operator++(&i_2.forward);
          lVar18 = (long)iVar4;
          bVar3 = IntView<0>::indomain(this_00,lVar18);
        } while (bVar3);
        pIVar12 = (this->a).data;
        if (so.lazy == true) {
          pIVar11 = (this->y).var;
          uVar7 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xd])(pIVar11,lVar18,0);
          pIVar11 = (this->x).var;
          uVar8 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar11,(long)(int)uVar5 - (long)(this->x).b,1);
          uVar20 = (ulong)(uVar8 ^ 1) << 0x20 | (long)(int)(uVar7 ^ 1) << 2 | 3;
        }
        else {
          uVar20 = 0;
        }
        pIVar11 = pIVar12[uVar5].var;
        iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0x11])
                          (pIVar11,lVar18,uVar20,1);
      } while ((char)iVar4 != '\0');
      return false;
    }
    bVar3 = IntView<0>::indomain(this_00,lVar18);
    if (bVar3) {
      pTVar9 = this->num_support;
      puVar1 = (uint *)this->support[lVar18];
      iVar4 = pTVar9[lVar18].v;
      if (iVar4 < 1) {
        uVar20 = 0;
      }
      else {
        bVar3 = IntView<4>::indomain(this_01,(long)(int)*puVar1);
        if ((bVar3) && (bVar3 = IntView<0>::indomain((this->a).data + *puVar1,lVar18), bVar3))
        goto LAB_001849b3;
        uVar20 = 0;
        do {
          bVar3 = IntView<4>::indomain(this_01,(long)(int)puVar1[uVar20]);
          if ((bVar3) &&
             (bVar3 = IntView<0>::indomain((this->a).data + puVar1[uVar20],lVar18), bVar3)) {
            pTVar9 = this->num_support;
            iVar4 = pTVar9[lVar18].v;
            break;
          }
          uVar20 = uVar20 + 1;
          pTVar9 = this->num_support;
          iVar4 = pTVar9[lVar18].v;
        } while ((long)uVar20 < (long)iVar4);
      }
      iVar6 = (int)uVar20;
      if (iVar6 == iVar4) {
        if (so.lazy == true) {
          pIVar11 = (this->x).var;
          this_02 = Reason_new(((pIVar11->max).v - (pIVar11->min).v) + 4);
          iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
          pLVar10 = Clause::operator[](this_02,1);
          pLVar10->x = iVar4;
          iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          pLVar10 = Clause::operator[](this_02,2);
          pLVar10->x = iVar4;
          pIVar11 = (this->x).var;
          iVar4 = (pIVar11->min).v;
          iVar6 = (this->x).b;
          iVar19 = iVar6 + iVar4 + 3;
          for (uVar20 = (ulong)(iVar6 + iVar4); (long)uVar20 <= (long)((pIVar11->max).v + iVar6);
              uVar20 = uVar20 + 1) {
            iVar4 = (pIVar11->min).v;
            bVar3 = IntView<4>::indomain(this_01,uVar20);
            if (bVar3) {
              pIVar12 = (this->a).data + (uVar20 & 0xffffffff);
              lVar17 = lVar18;
            }
            else {
              lVar17 = uVar20 - (long)(this->x).b;
              pIVar12 = (IntView<0> *)this_01;
            }
            uVar5 = (*(pIVar12->var->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar12->var,lVar17,0);
            pLVar10 = Clause::operator[](this_02,iVar19 - (iVar6 + iVar4));
            pLVar10->x = uVar5 ^ 1;
            pIVar11 = (this->x).var;
            iVar6 = (this->x).b;
            iVar19 = iVar19 + 1;
          }
        }
        else {
          this_02 = (Clause *)0x0;
        }
        iVar4 = (*(this_00->var->super_Var).super_Branching._vptr_Branching[0x11])
                          (this_00->var,lVar18,this_02,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      else {
        piVar2 = this->temp_sup;
        uVar20 = uVar20 & 0xffffffff;
        for (uVar15 = 0; puVar14 = puVar1, uVar16 = uVar20, uVar20 != uVar15; uVar15 = uVar15 + 1) {
          piVar2[uVar15] = puVar1[uVar15];
        }
        for (; iVar4 = pTVar9[lVar18].v, (long)uVar16 < (long)iVar4; uVar16 = uVar16 + 1) {
          *puVar14 = puVar14[uVar20];
          puVar14 = puVar14 + 1;
        }
        piVar2 = this->temp_sup;
        for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
          puVar1[(long)(iVar4 - iVar6) + uVar15] = piVar2[uVar15];
        }
        Tint::operator-=(pTVar9 + lVar18,iVar6);
      }
    }
LAB_001849b3:
    lVar18 = lVar18 + 1;
    pIVar11 = this_00->var;
  } while( true );
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}